

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void GenStateInitBlock(jx9_gen_state *pGen,GenBlock *pBlock,sxi32 iType,sxu32 nFirstInstr,
                      void *pUserData)

{
  jx9_vm *pjVar1;
  
  pBlock->nFirstInstr = nFirstInstr;
  pBlock->pUserData = pUserData;
  pBlock->pGen = pGen;
  pBlock->iFlags = iType;
  pBlock->pParent = (GenBlock *)0x0;
  pBlock->bPostContinue = '\0';
  pjVar1 = pGen->pVm;
  (pBlock->aJumpFix).nUsed = 0;
  (pBlock->aJumpFix).nSize = 0;
  (pBlock->aJumpFix).eSize = 8;
  (pBlock->aJumpFix).nCursor = 0;
  (pBlock->aJumpFix).pAllocator = &pjVar1->sAllocator;
  (pBlock->aJumpFix).pBase = (void *)0x0;
  (pBlock->aJumpFix).pUserData = (void *)0x0;
  (pBlock->aPostContFix).nUsed = 0;
  (pBlock->aPostContFix).nSize = 0;
  (pBlock->aPostContFix).eSize = 8;
  (pBlock->aPostContFix).nCursor = 0;
  (pBlock->aPostContFix).pAllocator = &pjVar1->sAllocator;
  (pBlock->aPostContFix).pBase = (void *)0x0;
  (pBlock->aPostContFix).pUserData = (void *)0x0;
  return;
}

Assistant:

static void GenStateInitBlock(
	jx9_gen_state *pGen, /* Code generator state */
	GenBlock *pBlock,    /* Target block */
	sxi32 iType,         /* Block type [i.e: loop, conditional, function body, etc.]*/
	sxu32 nFirstInstr,   /* First instruction to compile */
	void *pUserData      /* Upper layer private data */
	)
{
	/* Initialize block fields */
	pBlock->nFirstInstr = nFirstInstr;
	pBlock->pUserData   = pUserData;
	pBlock->pGen        = pGen;
	pBlock->iFlags      = iType;
	pBlock->pParent     = 0;
	pBlock->bPostContinue = 0;
	SySetInit(&pBlock->aJumpFix, &pGen->pVm->sAllocator, sizeof(JumpFixup));
	SySetInit(&pBlock->aPostContFix, &pGen->pVm->sAllocator, sizeof(JumpFixup));
}